

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O2

void listelem_add_block(listelem_alloc_t *list,char *caller_file,int caller_line)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  ulong uVar4;
  char **ptr;
  glist_t pgVar5;
  long lVar6;
  char **ppcVar7;
  int val;
  size_t elem_size;
  ulong n_elem;
  ulong uVar8;
  bool bVar9;
  
  if (list->blocksize == (glist_t)0x0) {
    val = 0x32;
  }
  else {
    val = *(int *)&list->blocksize->data;
  }
  if (list->blk_alloc == 0) {
    uVar3 = val * 2;
    uVar4 = (ulong)uVar3;
    elem_size = list->elemsize;
    uVar8 = elem_size * (long)(int)uVar3;
    n_elem = (long)(int)uVar3;
    if (0x40000 < uVar8) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = elem_size;
      uVar4 = SUB168((ZEXT416(0) << 0x40 | ZEXT816(0x40000)) / auVar1,0);
      uVar8 = uVar4 * elem_size;
      n_elem = uVar4;
    }
    val = (int)uVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    list->blk_alloc = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x40000)) / auVar2,0);
  }
  else {
    elem_size = list->elemsize;
    n_elem = (ulong)val;
  }
  ptr = (char **)__ckd_calloc__(n_elem,elem_size,caller_file,caller_line);
  list->freelist = ptr;
  pgVar5 = glist_add_ptr(list->blocks,ptr);
  list->blocks = pgVar5;
  pgVar5 = glist_add_int32(list->blocksize,val);
  list->blocksize = pgVar5;
  lVar6 = (long)(val + -1);
  while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
    ppcVar7 = (char **)(list->elemsize + (long)ptr);
    *ptr = (char *)ppcVar7;
    ptr = ppcVar7;
  }
  *ptr = (char *)0x0;
  list->blk_alloc = list->blk_alloc - 1;
  list->n_blocks = list->n_blocks + 1;
  return;
}

Assistant:

static void
listelem_add_block(listelem_alloc_t *list, char *caller_file, int caller_line)
{
    char **cpp, *cp;
    size_t j;
    int32 blocksize;

    blocksize = list->blocksize ? gnode_int32(list->blocksize) : MIN_ALLOC;
    /* Check if block size should be increased (if many requests for this size) */
    if (list->blk_alloc == 0) {
        /* See above.  No sense in allocating blocks bigger than
         * 256KiB (well, actually, there might be, but we'll worry
         * about that later). */
	blocksize <<= 1;
        if (blocksize * list->elemsize > (1 << 18))
            blocksize = (1 << 18) / list->elemsize;
	list->blk_alloc = (1 << 18) / (blocksize * list->elemsize);
    }

    /* Allocate block */
    cpp = list->freelist =
	(char **) __ckd_calloc__(blocksize, list->elemsize,
				 caller_file, caller_line);
    list->blocks = glist_add_ptr(list->blocks, cpp);
    list->blocksize = glist_add_int32(list->blocksize, blocksize);
    cp = (char *) cpp;
    /* Link up the blocks via their first machine word. */
    for (j = blocksize - 1; j > 0; --j) {
	cp += list->elemsize;
	*cpp = cp;
	cpp = (char **) cp;
    }
    /* Make sure the last element's forward pointer is NULL */
    *cpp = NULL;
    --list->blk_alloc;
    ++list->n_blocks;
}